

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void searchtest(void)

{
  search234_state ss_00;
  undefined1 auStack_478 [8];
  search234_state ss;
  char local_448 [4];
  int n;
  char directionbuf [600];
  char *p;
  char *expected [60];
  
  if (verbose != 0) {
    printf("beginning searchtest:");
  }
  ss._node._4_4_ = 0;
  while( true ) {
    directionbuf._592_8_ = index234(tree,ss._node._4_4_);
    if ((char *)directionbuf._592_8_ == (char *)0x0) break;
    expected[(long)(int)ss._node._4_4_ + -1] = (char *)directionbuf._592_8_;
    if (verbose != 0) {
      printf(" %d=%s",(ulong)ss._node._4_4_,directionbuf._592_8_);
    }
    ss._node._4_4_ = ss._node._4_4_ + 1;
  }
  if (verbose != 0) {
    printf(" count=%d\n",(ulong)ss._node._4_4_);
  }
  search234_start((search234_state *)auStack_478,tree);
  ss_00._8_8_ = ss.element;
  ss_00.element = (void *)auStack_478;
  ss_00._hi = ss.index;
  ss_00._last = ss._lo;
  ss_00._base = ss._hi;
  ss_00._28_4_ = ss._last;
  ss_00._node = (void *)ss._24_8_;
  searchtest_recurse(ss_00,0,ss._node._4_4_,&p,local_448,local_448);
  return;
}

Assistant:

void searchtest(void)
{
    char *expected[NSTR], *p;
    char directionbuf[NSTR * 10];
    int n;
    search234_state ss;

    if (verbose)
        printf("beginning searchtest:");
    for (n = 0; (p = index234(tree, n)) != NULL; n++) {
        expected[n] = p;
        if (verbose)
            printf(" %d=%s", n, p);
    }
    if (verbose)
        printf(" count=%d\n", n);

    search234_start(&ss, tree);
    searchtest_recurse(ss, 0, n, expected, directionbuf, directionbuf);
}